

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O2

void runtest<boost::tuples::tuple<std::array<int,3ul>&,boost::array<int,3ul>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
               (string *header,
               tuple<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
               *arg)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)header);
  runtest_maybe_dobin<boost::tuples::tuple<std::array<int,3ul>&,boost::array<int,3ul>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,true>
            (&local_30,arg);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void runtest(std::string header, const T &arg) {
    runtest_maybe_dobin<T, true>(header, arg);
}